

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

FILE * s3open(char *file_name,char *mode,uint32 *swap)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  long lVar5;
  char id [32];
  char attrib [256];
  undefined1 local_2158 [2];
  char cStack_2156;
  undefined4 local_2138;
  undefined3 uStack_2134;
  char local_2038 [8200];
  
  cVar1 = *mode;
  if (cVar1 == 'a') {
    if (mode[1] != 'b') {
      return (FILE *)0x0;
    }
    __stream = fopen(file_name,mode);
    if (__stream == (FILE *)0x0) {
      pcVar4 = "Unable to open %s for appending";
      lVar5 = 0x125;
      goto LAB_0010815a;
    }
    lVar5 = ftell(__stream);
    if (lVar5 != 0) {
      return (FILE *)__stream;
    }
  }
  else {
    if (cVar1 != 'w') {
      if (cVar1 != 'r') {
        return (FILE *)0x0;
      }
      if (mode[1] != 'b') {
        return (FILE *)0x0;
      }
      __stream = fopen(file_name,mode);
      if (__stream == (FILE *)0x0) {
        pcVar4 = "Unable to open %s for reading";
        lVar5 = 0x104;
LAB_0010815a:
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                       ,lVar5,pcVar4,file_name);
        return (FILE *)0x0;
      }
      iVar2 = __isoc99_fscanf(__stream,"%31s",local_2158);
      if (iVar2 == 1) {
        if (cStack_2156 == '\0' && (short)_local_2158 == 0x3373) {
          s3clr_fattr();
          __isoc99_fscanf(__stream,"%s",&local_2138);
          if (CONCAT31(uStack_2134,local_2138._3_1_) != 0x726468 || local_2138 != 0x68646e65) {
            do {
              __isoc99_fscanf(__stream," %[^\n]",local_2038);
              s3add_fattr((char *)&local_2138,local_2038,1);
              __isoc99_fscanf(__stream,"%s",&local_2138);
            } while (CONCAT31(uStack_2134,local_2138._3_1_) != 0x726468 || local_2138 != 0x68646e65)
            ;
          }
          fgetc(__stream);
          local_2038[0] = '\0';
          uVar3 = swap_check((FILE *)__stream);
          if (uVar3 < 2) {
            *swap = uVar3;
            return (FILE *)__stream;
          }
          if (uVar3 != 0xffffffff) {
            err_msg(ERR_FATAL,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                    ,0xbb,"unexpected result from swap_check()\n");
            exit(1);
          }
          pcVar4 = "Error reading byte order magic number\n";
          lVar5 = 0xb1;
        }
        else {
          pcVar4 = "No SPHINX-III file ID at beginning of file\n";
          lVar5 = 0xa5;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                ,lVar5,pcVar4);
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                       ,0x9e,"Unable to read the file ID");
      }
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
              ,0x109,"Error reading header for %s\n",file_name);
      goto LAB_001081ac;
    }
    if (mode[1] != 'b') {
      return (FILE *)0x0;
    }
    __stream = fopen(file_name,mode);
    if (__stream == (FILE *)0x0) {
      pcVar4 = "Unable to open %s for writing";
      lVar5 = 0x115;
      goto LAB_0010815a;
    }
  }
  iVar2 = wr_bin_hdr((FILE *)__stream);
  if (iVar2 == 0) {
    return (FILE *)__stream;
  }
LAB_001081ac:
  fclose(__stream);
  return (FILE *)0x0;
}

Assistant:

FILE *
s3open(const char *file_name,
       const char *mode,
       uint32 *swap)
{
    FILE *fp = NULL;

    if (mode[0] == 'r' && mode[1] == 'b') {
	/* Read a binary file */

	fp = fopen(file_name, mode);
	if (fp == NULL) {
	    E_ERROR_SYSTEM("Unable to open %s for reading",
			  file_name);
	    return NULL;
	}

	if (rd_bin_hdr(fp, swap) != S3_SUCCESS) {
	    E_ERROR("Error reading header for %s\n", file_name);

	    goto error_loc;
	}

	return fp;
    }
    else if (mode[0] == 'w' && mode[1] == 'b') {
	/* Write a binary file */

	fp = fopen(file_name, mode);
	if (fp == NULL) {
	    E_ERROR_SYSTEM("Unable to open %s for writing", file_name);
	    
	    goto error_loc;
	}

	if (wr_bin_hdr(fp) != S3_SUCCESS) {
	    goto error_loc;
	}
	
	return fp;
    }
    else if (mode[0] == 'a' && mode[1] == 'b') {
	/* Append to a binary file. */

	fp = fopen(file_name, mode);
	if (fp == NULL) {
	    E_ERROR_SYSTEM("Unable to open %s for appending", file_name);
	    
	    goto error_loc;
	}

	if (ftell(fp) == 0) {
	    /* Write a header when no data */
	    if (wr_bin_hdr(fp) != S3_SUCCESS) {
		goto error_loc;
	    }
	}
	
	return fp;
    }
    
error_loc:
    if (fp)
	fclose(fp);

    return NULL;
}